

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O3

bool Function_Template::form2_RgbToBgr(RgbToBgrForm2 RgbToBgr)

{
  uchar uVar1;
  uint8_t uVar2;
  bool bVar3;
  Image output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image input;
  ImageTemplate<unsigned_char> local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  Image local_48;
  
  uVar2 = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_88,0,0,'\x01','\x01');
  Test_Helper::uniformRGBImage(&local_48,uVar2,&local_88);
  local_88._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_88);
  Unit_Test::intensityArray(&local_60,3);
  Unit_Test::fillImage(&local_48,0,0,local_48._width,local_48._height,&local_60);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (&local_88,&local_48,local_48._width,local_48._height,local_48._colorCount,
             local_48._alignment);
  uVar2 = Unit_Test::intensityValue();
  Unit_Test::fillImage(&local_88,0,0,local_88._width,local_88._height,uVar2);
  (*RgbToBgr)(&local_48,&local_88);
  uVar1 = *local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  *local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start =
       local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start[2];
  local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = uVar1;
  bVar3 = Unit_Test::verifyImage(&local_88,&local_60,false);
  local_88._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_88);
  if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  local_48._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_48);
  return bVar3;
}

Assistant:

bool form2_RgbToBgr(RgbToBgrForm2 RgbToBgr)
    {
        PenguinV_Image::Image input = uniformRGBImage( intensityValue() );
        std::vector< uint8_t > intensity = intensityArray( 3 );

        fillImage( input, 0, 0, input.width(), input.height(), intensity );

        PenguinV_Image::Image output = input.generate( input.width(), input.height(), input.colorCount(), input.alignment() );
        fillImage( output, 0, 0, output.width(), output.height(), intensityValue() );

        RgbToBgr( input, output );

        std::swap( intensity[0], intensity[2] );

        return verifyImage( output, intensity, false );
    }